

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_function.hpp
# Opt level: O0

void __thiscall duckdb::CopyFunction::CopyFunction(CopyFunction *this,CopyFunction *param_2)

{
  TableFunction *in_RSI;
  Function *in_RDI;
  Function *unaff_retaddr;
  TableFunction *in_stack_ffffffffffffffe8;
  
  Function::Function(unaff_retaddr,in_RDI);
  in_RDI->_vptr_Function = (_func_int **)&PTR__CopyFunction_034f40a8;
  memcpy(in_RDI + 1,&(in_RSI->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments,
         0x90);
  TableFunction::TableFunction(in_RSI,in_stack_ffffffffffffffe8);
  ::std::__cxx11::string::string((string *)&in_RDI[9].name,(string *)&in_RSI[1].bind_operator);
  return;
}

Assistant:

explicit CopyFunction(const string &name)
	    : Function(name), plan(nullptr), copy_to_select(nullptr), copy_to_bind(nullptr),
	      copy_to_initialize_local(nullptr), copy_to_initialize_global(nullptr),
	      copy_to_get_written_statistics(nullptr), copy_to_sink(nullptr), copy_to_combine(nullptr),
	      copy_to_finalize(nullptr), execution_mode(nullptr), prepare_batch(nullptr), flush_batch(nullptr),
	      desired_batch_size(nullptr), rotate_files(nullptr), rotate_next_file(nullptr), serialize(nullptr),
	      deserialize(nullptr), copy_from_bind(nullptr) {
	}